

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O1

node_type * __thiscall Tree<NULLC::Range>::left_rotate(Tree<NULLC::Range> *this,node_type *x)

{
  node_type *pnVar1;
  node<NULLC::Range> *pnVar2;
  int iVar3;
  int iVar4;
  
  pnVar1 = x->right;
  pnVar2 = pnVar1->left;
  pnVar1->left = x;
  x->right = pnVar2;
  iVar3 = 0;
  iVar4 = 0;
  if (x->left != (node<NULLC::Range> *)0x0) {
    iVar4 = x->left->height;
  }
  if (pnVar2 != (node<NULLC::Range> *)0x0) {
    iVar3 = pnVar2->height;
  }
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  iVar3 = iVar3 + 1;
  x->height = iVar3;
  iVar4 = 0;
  if (pnVar1->right != (node<NULLC::Range> *)0x0) {
    iVar4 = pnVar1->right->height;
  }
  if (x == (node_type *)0x0) {
    iVar3 = 0;
  }
  if (iVar3 <= iVar4) {
    iVar3 = iVar4;
  }
  pnVar1->height = iVar3 + 1;
  return pnVar1;
}

Assistant:

node_type* left_rotate(node_type* x)
	{
		node_type *y = x->right;
		node_type *T2 = y->left;

		y->left = x;
		x->right = T2;

		x->height = detail::max(get_height(x->left), get_height(x->right)) + 1;
		y->height = detail::max(get_height(y->left), get_height(y->right)) + 1;

		return y;
	}